

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

int64_t __thiscall flexbuffers::Reference::AsInt64(Reference *this)

{
  byte bVar1;
  double *pdVar2;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  size_t *psVar6;
  size_t sVar7;
  ulong *puVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  char *endptr;
  uint8_t *local_38;
  Vector local_30;
  
  sVar7 = 0;
  switch(this->type_) {
  case FBT_UINT:
    psVar6 = (size_t *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        return (ulong)(byte)*psVar6;
      }
      return (ulong)(ushort)*psVar6;
    }
    if (bVar1 < 8) {
      return (ulong)(uint)*psVar6;
    }
    goto LAB_0015d78a;
  case FBT_FLOAT:
    pdVar2 = (double *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        iVar3 = (int)*(char *)pdVar2;
      }
      else {
        iVar3 = (int)*(short *)pdVar2;
      }
LAB_0015d7e8:
      dVar11 = (double)iVar3;
    }
    else if (bVar1 < 8) {
      dVar11 = (double)*(float *)pdVar2;
    }
    else {
      dVar11 = *pdVar2;
    }
    goto LAB_0015d7ec;
  case FBT_KEY:
  case FBT_MAP:
    break;
  case FBT_STRING:
    AsString((String *)&local_30,this);
    if (local_30.super_Sized.super_Object.data_ == (uint8_t *)0x0) {
      __assert_fail("str",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/util.h"
                    ,0x11f,
                    "bool flatbuffers::StringToIntegerImpl(T *, const char *const, const int, const bool) [T = long]"
                   );
    }
    piVar4 = __errno_location();
    *piVar4 = 0;
    local_38 = local_30.super_Sized.super_Object.data_;
    sVar5 = strtoll_l((char *)local_30.super_Sized.super_Object.data_,(char **)&local_38,10,
                      flatbuffers::ClassicLocale::instance_);
    sVar7 = 0;
    if (((local_38 != local_30.super_Sized.super_Object.data_) && (*local_38 == '\0')) &&
       (sVar7 = 0, *piVar4 == 0)) {
      sVar7 = sVar5;
    }
    break;
  case FBT_INDIRECT_INT:
    puVar8 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar9 = (ulong)(byte)*puVar8;
      }
      else {
        uVar9 = (ulong)(ushort)*puVar8;
      }
    }
    else if (bVar1 < 8) {
      uVar9 = (ulong)(uint)*puVar8;
    }
    else {
      uVar9 = *puVar8;
    }
    lVar10 = -uVar9;
    bVar1 = this->byte_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        return (long)*(char *)((long)puVar8 + lVar10);
      }
      return (long)*(short *)((long)puVar8 + lVar10);
    }
    if (bVar1 < 8) {
      return (long)*(int *)((long)puVar8 + lVar10);
    }
    goto LAB_0015d85f;
  case FBT_INDIRECT_UINT:
    puVar8 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar9 = (ulong)(byte)*puVar8;
      }
      else {
        uVar9 = (ulong)(ushort)*puVar8;
      }
    }
    else if (bVar1 < 8) {
      uVar9 = (ulong)(uint)*puVar8;
    }
    else {
      uVar9 = *puVar8;
    }
    lVar10 = -uVar9;
    bVar1 = this->byte_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        return (ulong)*(byte *)((long)puVar8 + lVar10);
      }
      return (ulong)*(ushort *)((long)puVar8 + lVar10);
    }
    if (bVar1 < 8) {
      return (ulong)*(uint *)((long)puVar8 + lVar10);
    }
LAB_0015d85f:
    sVar7 = *(size_t *)((long)puVar8 + lVar10);
    break;
  case FBT_INDIRECT_FLOAT:
    puVar8 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar9 = (ulong)(byte)*puVar8;
      }
      else {
        uVar9 = (ulong)(ushort)*puVar8;
      }
    }
    else if (bVar1 < 8) {
      uVar9 = (ulong)(uint)*puVar8;
    }
    else {
      uVar9 = *puVar8;
    }
    lVar10 = -uVar9;
    bVar1 = this->byte_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        iVar3 = (int)*(char *)((long)puVar8 + lVar10);
      }
      else {
        iVar3 = (int)*(short *)((long)puVar8 + lVar10);
      }
      goto LAB_0015d7e8;
    }
    if (bVar1 < 8) {
      dVar11 = (double)*(float *)((long)puVar8 + lVar10);
    }
    else {
      dVar11 = *(double *)((long)puVar8 + lVar10);
    }
LAB_0015d7ec:
    sVar7 = (long)dVar11;
    break;
  case FBT_VECTOR:
    AsVector(&local_30,this);
    sVar7 = local_30.super_Sized.size_;
    break;
  default:
    if (this->type_ != FBT_BOOL) {
      return 0;
    }
  case FBT_INT:
    psVar6 = (size_t *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        sVar7 = (long)(char)(byte)*psVar6;
      }
      else {
        sVar7 = (long)(short)(ushort)*psVar6;
      }
    }
    else if (bVar1 < 8) {
      sVar7 = (long)(int)(uint)*psVar6;
    }
    else {
LAB_0015d78a:
      sVar7 = *psVar6;
    }
  }
  return sVar7;
}

Assistant:

int64_t AsInt64() const {
    if (type_ == FBT_INT) {
      // A fast path for the common case.
      return ReadInt64(data_, parent_width_);
    } else
      switch (type_) {
        case FBT_INDIRECT_INT: return ReadInt64(Indirect(), byte_width_);
        case FBT_UINT: return ReadUInt64(data_, parent_width_);
        case FBT_INDIRECT_UINT: return ReadUInt64(Indirect(), byte_width_);
        case FBT_FLOAT:
          return static_cast<int64_t>(ReadDouble(data_, parent_width_));
        case FBT_INDIRECT_FLOAT:
          return static_cast<int64_t>(ReadDouble(Indirect(), byte_width_));
        case FBT_NULL: return 0;
        case FBT_STRING: return flatbuffers::StringToInt(AsString().c_str());
        case FBT_VECTOR: return static_cast<int64_t>(AsVector().size());
        case FBT_BOOL: return ReadInt64(data_, parent_width_);
        default:
          // Convert other things to int.
          return 0;
      }
  }